

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void __thiscall
cs_impl::runtime_cs_ext::async_callable::async_callable(async_callable *this,var *fn,vector *data)

{
  pointer paVar1;
  callable *__x;
  
  __x = any::const_val<cs::callable>(fn);
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::function
            ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
             this,&__x->mFunc);
  (this->func).mType = __x->mType;
  paVar1 = (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start =
       (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = paVar1;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detach_args(this);
  return;
}

Assistant:

async_callable(const var &fn, vector data) : func(fn.const_val<callable>()), args(std::move(data))
			{
				detach_args();
			}